

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

double __thiscall cnn::expr::tanh(expr *this,double __x)

{
  initializer_list<cnn::VariableIndex> *in_RSI;
  double extraout_XMM0_Qa;
  VariableIndex *i;
  Expression *this_00;
  VariableIndex local_2c;
  VariableIndex *local_28;
  undefined8 local_20;
  ComputationGraph *this_01;
  
  this_00 = (Expression *)in_RSI->_M_array;
  i = in_RSI->_M_array;
  this_01 = (ComputationGraph *)this;
  VariableIndex::VariableIndex(&local_2c,(VariableIndex *)&in_RSI->_M_len);
  local_28 = &local_2c;
  local_20 = 1;
  ComputationGraph::add_function<cnn::Tanh>(this_01,in_RSI);
  Expression::Expression(this_00,(ComputationGraph *)this,i);
  return extraout_XMM0_Qa;
}

Assistant:

Expression tanh(const Expression& x) { return Expression(x.pg, x.pg->add_function<Tanh>({x.i})); }